

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Partial.cpp
# Opt level: O0

void __thiscall MT32Emu::Partial::~Partial(Partial *this)

{
  Partial *this_local;
  
  if (this->la32Pair != (LA32PartialPair *)0x0) {
    (*this->la32Pair->_vptr_LA32PartialPair[1])();
  }
  if (this->tva != (TVA *)0x0) {
    operator_delete(this->tva);
  }
  if (this->tvp != (TVP *)0x0) {
    operator_delete(this->tvp);
  }
  if (this->tvf != (TVF *)0x0) {
    operator_delete(this->tvf);
  }
  return;
}

Assistant:

Partial::~Partial() {
	delete la32Pair;
	delete tva;
	delete tvp;
	delete tvf;
}